

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O0

Expression *
slang::ast::InsideExpression::fromSyntax
          (Compilation *compilation,InsideExpressionSyntax *syntax,ASTContext *context)

{
  SourceRange sourceRange;
  SourceRange range_00;
  SourceRange range_01;
  string_view arg;
  string_view arg_00;
  span<const_slang::syntax::ExpressionSyntax_*const,_18446744073709551615UL> expressions_00;
  bool bVar1;
  int iVar2;
  RangeListSyntax *pRVar3;
  Expression *pEVar4;
  undefined4 extraout_var;
  InsideExpression *pIVar5;
  Expression *this;
  UnaryExpression *pUVar6;
  Diagnostic *pDVar7;
  Diagnostic *pDVar8;
  SourceLocation startLoc;
  SourceLocation endLoc;
  Diagnostic *this_01;
  EVP_PKEY_CTX *src;
  Compilation *in_RDI;
  SourceRange SVar9;
  SourceRange range;
  Diagnostic *diag;
  basic_string_view<char,_std::char_traits<char>_> kindStr;
  UnaryExpression *unary;
  Expression *lhs;
  InsideExpression *result;
  span<const_slang::ast::Expression_*,_18446744073709551615UL> boundSpan;
  bool bad;
  SmallVector<const_slang::ast::Expression_*,_5UL> bound;
  ExpressionSyntax *elemSyntax;
  iterator __end2;
  iterator __begin2;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *__range2;
  SmallVector<const_slang::syntax::ExpressionSyntax_*,_5UL> expressions;
  iterator_base<slang::syntax::ExpressionSyntax_*> *in_stack_fffffffffffffcd8;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *in_stack_fffffffffffffce0;
  SmallVector<const_slang::syntax::ExpressionSyntax_*,_5UL> *in_stack_fffffffffffffce8;
  span<const_slang::syntax::ExpressionSyntax_*const,_18446744073709551615UL>
  *in_stack_fffffffffffffcf0;
  SourceLocation SVar10;
  Diagnostic *in_stack_fffffffffffffcf8;
  SourceLocation in_stack_fffffffffffffd00;
  SourceLocation in_stack_fffffffffffffd08;
  undefined8 in_stack_fffffffffffffd10;
  DiagCode DVar11;
  Diagnostic *in_stack_fffffffffffffd20;
  span<const_slang::ast::Expression_*,_18446744073709551615UL> *in_stack_fffffffffffffd28;
  Expression *in_stack_fffffffffffffd30;
  Type *in_stack_fffffffffffffd38;
  BumpAllocator *in_stack_fffffffffffffd40;
  SourceRange local_1a8;
  SourceLocation local_198;
  SourceLocation local_190;
  size_t local_188;
  char *pcStack_180;
  SourceLocation local_178;
  SourceLocation SStack_170;
  undefined4 local_164;
  Diagnostic *local_160;
  size_t local_158;
  ASTContext *in_stack_fffffffffffffeb8;
  ExpressionSyntax *in_stack_fffffffffffffed0;
  pointer in_stack_fffffffffffffed8;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffee0;
  SmallVectorBase<const_slang::ast::Expression_*> *in_stack_fffffffffffffee8;
  span<const_slang::ast::Expression_*,_18446744073709551615UL> local_108;
  Compilation *local_f8;
  SourceLocation SStack_f0;
  byte local_e1;
  SmallVectorBase<const_slang::ast::Expression_*> local_e0 [2];
  ExpressionSyntax *local_a0;
  iterator local_98;
  iterator local_88;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *local_68;
  Compilation *local_10;
  InsideExpression *local_8;
  SourceLocation this_00;
  
  local_10 = in_RDI;
  SmallVector<const_slang::syntax::ExpressionSyntax_*,_5UL>::SmallVector
            ((SmallVector<const_slang::syntax::ExpressionSyntax_*,_5UL> *)0xbb3cdc);
  pRVar3 = not_null<slang::syntax::RangeListSyntax_*>::operator->
                     ((not_null<slang::syntax::RangeListSyntax_*> *)0xbb3ced);
  local_68 = &pRVar3->valueRanges;
  local_88 = slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::begin
                       ((SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)0xbb3d18);
  local_98 = slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::end
                       (in_stack_fffffffffffffce0);
  while( true ) {
    bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>_>
                      ((self_type *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
    DVar11 = SUB84((ulong)in_stack_fffffffffffffd10 >> 0x20,0);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_a0 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>,_false>
               ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>,_false>
                            *)0xbb3dc3);
    SmallVectorBase<const_slang::syntax::ExpressionSyntax_*>::push_back
              ((SmallVectorBase<const_slang::syntax::ExpressionSyntax_*> *)in_stack_fffffffffffffce0
               ,(ExpressionSyntax **)in_stack_fffffffffffffcd8);
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>,_false>
    ::
    operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>_>
              ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>,_false>
                *)in_stack_fffffffffffffce0);
  }
  SmallVector<const_slang::ast::Expression_*,_5UL>::SmallVector
            ((SmallVector<const_slang::ast::Expression_*,_5UL> *)0xbb3e2d);
  pEVar4 = (Expression *)
           not_null<slang::syntax::ExpressionSyntax_*>::operator*
                     ((not_null<slang::syntax::ExpressionSyntax_*> *)0xbb3e4e);
  std::span<const_slang::syntax::ExpressionSyntax_*const,_18446744073709551615UL>::
  span<slang::SmallVector<const_slang::syntax::ExpressionSyntax_*,_5UL>_&>
            (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  SVar10 = (SourceLocation)local_e0;
  expressions_00._M_extent._M_extent_value = in_stack_fffffffffffffee0._M_extent_value;
  expressions_00._M_ptr = in_stack_fffffffffffffed8;
  bVar1 = Expression::bindMembershipExpressions
                    (in_stack_fffffffffffffeb8,local_158._14_2_,local_158._13_1_,local_158._12_1_,
                     local_158._11_1_,local_158._10_1_,in_stack_fffffffffffffed0,expressions_00,
                     in_stack_fffffffffffffee8);
  local_e1 = ~bVar1 & 1;
  iVar2 = SmallVectorBase<const_slang::ast::Expression_*>::copy
                    (local_e0,(EVP_PKEY_CTX *)local_10,src);
  local_108._M_ptr = (pointer)CONCAT44(extraout_var,iVar2);
  Compilation::getLogicType(local_10);
  std::span<const_slang::ast::Expression_*,_18446744073709551615UL>::operator[](&local_108,0);
  std::span<const_slang::ast::Expression_*,_18446744073709551615UL>::subspan
            ((span<const_slang::ast::Expression_*,_18446744073709551615UL> *)SVar10,
             (size_type)SStack_f0,(size_type)local_f8);
  slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_fffffffffffffd30);
  pIVar5 = BumpAllocator::
           emplace<slang::ast::InsideExpression,slang::ast::Type_const&,slang::ast::Expression_const&,std::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::SourceRange>
                     (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,in_stack_fffffffffffffd30,
                      in_stack_fffffffffffffd28,(SourceRange *)in_stack_fffffffffffffd20);
  if ((local_e1 & 1) == 0) {
    std::span<const_slang::ast::Expression_*,_18446744073709551615UL>::operator[](&local_108,0);
    this = Expression::unwrapImplicitConversions((Expression *)local_f8);
    local_8 = pIVar5;
    if (this->kind == UnaryOp) {
      bVar1 = Expression::isParenthesized(this);
      if (!bVar1) {
        pUVar6 = Expression::as<slang::ast::UnaryExpression>(this);
        if (pUVar6->op == LogicalNot) {
          pUVar6 = Expression::as<slang::ast::UnaryExpression>(this);
          _local_158 = sv((char *)local_f8,(size_t)pEVar4);
          local_164 = 0xc80007;
          local_178 = (pUVar6->opRange).startLoc;
          SStack_170 = (pUVar6->opRange).endLoc;
          sourceRange.endLoc = in_stack_fffffffffffffd08;
          sourceRange.startLoc = in_stack_fffffffffffffd00;
          pDVar7 = ASTContext::addDiag((ASTContext *)in_stack_fffffffffffffcf8,DVar11,sourceRange);
          local_188 = local_158;
          arg._M_str = (char *)pDVar7;
          arg._M_len = (size_t)in_stack_fffffffffffffd28;
          pcStack_180 = local_158._8_8_;
          local_160 = pDVar7;
          pDVar8 = Diagnostic::operator<<(in_stack_fffffffffffffd20,arg);
          SVar9 = parsing::Token::range((Token *)in_stack_fffffffffffffd00);
          local_190 = SVar9.endLoc;
          this_00 = SVar9.startLoc;
          SVar9.endLoc = SVar10;
          SVar9.startLoc = SStack_f0;
          local_198 = this_00;
          Diagnostic::operator<<((Diagnostic *)local_f8,SVar9);
          pEVar4 = UnaryExpression::operand(pUVar6);
          startLoc = SourceRange::start(&pEVar4->sourceRange);
          DVar11 = SUB84((ulong)pEVar4 >> 0x20,0);
          SVar10 = startLoc;
          endLoc = SourceRange::end(&(pIVar5->super_Expression).sourceRange);
          SourceRange::SourceRange(&local_1a8,startLoc,endLoc);
          range_00.endLoc = SVar10;
          range_00.startLoc = endLoc;
          this_01 = Diagnostic::addNote(in_stack_fffffffffffffcf8,DVar11,range_00);
          arg_00._M_str = (char *)pDVar7;
          arg_00._M_len = (size_t)pDVar8;
          Diagnostic::operator<<((Diagnostic *)this_00,arg_00);
          range_01.endLoc = SVar10;
          range_01.startLoc = endLoc;
          Diagnostic::addNote(this_01,DVar11,range_01);
        }
      }
    }
  }
  else {
    local_8 = (InsideExpression *)Expression::badExpr(local_f8,pEVar4);
  }
  SmallVector<const_slang::ast::Expression_*,_5UL>::~SmallVector
            ((SmallVector<const_slang::ast::Expression_*,_5UL> *)0xbb4374);
  SmallVector<const_slang::syntax::ExpressionSyntax_*,_5UL>::~SmallVector
            ((SmallVector<const_slang::syntax::ExpressionSyntax_*,_5UL> *)0xbb4381);
  return &local_8->super_Expression;
}

Assistant:

Expression& InsideExpression::fromSyntax(Compilation& compilation,
                                         const InsideExpressionSyntax& syntax,
                                         const ASTContext& context) {
    SmallVector<const ExpressionSyntax*> expressions;
    for (auto elemSyntax : syntax.ranges->valueRanges)
        expressions.push_back(elemSyntax);

    SmallVector<const Expression*> bound;
    bool bad =
        !bindMembershipExpressions(context, TokenKind::InsideKeyword, /* requireIntegral */ false,
                                   /* unwrapUnpacked */ true, /* allowTypeReferences */ false,
                                   /* allowValueRange */ true, *syntax.expr, expressions, bound);

    auto boundSpan = bound.copy(compilation);
    auto result = compilation.emplace<InsideExpression>(compilation.getLogicType(), *boundSpan[0],
                                                        boundSpan.subspan(1), syntax.sourceRange());
    if (bad)
        return badExpr(compilation, result);

    // Warn about `!x inside {y, z}` where they probably meant `!(x inside {y, z})`
    auto& lhs = boundSpan[0]->unwrapImplicitConversions();
    if (lhs.kind == ExpressionKind::UnaryOp && !lhs.isParenthesized() &&
        lhs.as<UnaryExpression>().op == UnaryOperator::LogicalNot) {

        auto& unary = lhs.as<UnaryExpression>();
        auto kindStr = "'inside' expression"sv;
        auto& diag = context.addDiag(diag::LogicalNotParentheses, unary.opRange);
        diag << kindStr << syntax.inside.range();

        SourceRange range(unary.operand().sourceRange.start(), result->sourceRange.end());
        diag.addNote(diag::NoteLogicalNotFix, range) << kindStr;
        diag.addNote(diag::NoteLogicalNotSilence, lhs.sourceRange);
    }

    return *result;
}